

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O0

string * __thiscall Kernel::Term::functionName_abi_cxx11_(Term *this)

{
  string *psVar1;
  int in_stack_00000024;
  Signature *in_stack_00000028;
  
  psVar1 = Signature::functionName_abi_cxx11_(in_stack_00000028,in_stack_00000024);
  return psVar1;
}

Assistant:

const std::string& Term::functionName() const
{
#if VDEBUG
  static std::string nonexisting("<function does not exists>");
  if (_functor>=static_cast<unsigned>(env.signature->functions())) {
    return nonexisting;
  }
#endif

  return env.signature->functionName(_functor);
}